

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::renameFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  uint uVar2;
  uint src_00;
  int iVar3;
  string newName;
  string oldName;
  string local_70;
  string local_50;
  
  requireDStackDepth(this,4,"RENAME-FILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src_00 = ForthStack<unsigned_int>::getTop(this_00);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  moveFromDataSpace(this,&local_50,src_00,(ulong)uVar2);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  moveFromDataSpace(this,&local_70,src,(ulong)uVar1);
  iVar3 = rename(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
  uVar1 = 0xffffffb8;
  if (iVar3 == 0) {
    uVar1 = 0;
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void renameFile() {
	REQUIRE_DSTACK_DEPTH(4, "RENAME-FILE");
	auto lengthNew = SIZE_T(dStack.getTop()); pop();
	auto caddrNew = (dStack.getTop()); pop();
	auto lengthOld = SIZE_T(dStack.getTop()); pop();
	auto caddrOld = (dStack.getTop());
	std::string oldName{};
	moveFromDataSpace(oldName, caddrOld, lengthOld);
	std::string newName{};
	moveFromDataSpace(newName, caddrNew, lengthNew);
	auto result = std::rename(oldName.c_str(), newName.c_str());
	dStack.setTop(static_cast<Cell>(result?errorRenameFile:0));
}